

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O0

int av1_get_sbq_perceptual_ai(AV1_COMP *cpi,BLOCK_SIZE bsize,int mi_row,int mi_col)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  BLOCK_SIZE in_SIL;
  AV1_COMP *in_RDI;
  double dVar3;
  AV1_COMP *unaff_retaddr;
  int in_stack_00000014;
  int in_stack_00000018;
  BLOCK_SIZE in_stack_0000001f;
  AV1_COMP *in_stack_00000020;
  int qindex;
  DeltaQInfo *delta_q_info;
  double min_max_scale;
  double beta;
  int offset;
  int sb_wiener_var;
  int base_qindex;
  AV1_COMMON *cm;
  int local_8c;
  int local_88;
  int local_84;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  double local_68;
  double local_60;
  AV1_COMP *cpi_00;
  int in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((in_RDI->oxcf).enable_rate_guide_deltaq == 0) {
    iVar1 = (in_RDI->common).quant_params.base_qindex;
    cpi_00 = in_RDI;
    iVar2 = get_var_perceptual_ai
                      (unaff_retaddr,(BLOCK_SIZE)((uint)in_stack_fffffffffffffffc >> 0x18),
                       in_stack_fffffffffffffff8,(int)((ulong)in_RDI >> 0x20));
    local_68 = (double)cpi_00->norm_wiener_variance / (double)iVar2;
    dVar3 = get_max_scale(cpi_00,in_SIL,in_EDX,in_ECX);
    if (1.0 <= dVar3) {
      local_60 = get_max_scale(cpi_00,in_SIL,in_EDX,in_ECX);
    }
    else {
      local_60 = 1.0;
    }
    if (local_60 <= 1.0 / local_68) {
      local_68 = local_60;
    }
    else {
      local_68 = 1.0 / local_68;
    }
    local_68 = 1.0 / local_68;
    if (4.0 <= local_68) {
      local_68 = 4.0;
    }
    dVar3 = local_68;
    if (local_68 <= 0.25) {
      dVar3 = 0.25;
    }
    local_84 = av1_get_deltaq_offset
                         (SUB84(local_68,0),(int)((ulong)dVar3 >> 0x20),
                          (double)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    if ((in_RDI->common).delta_q_info.delta_q_res * 0x14 + -1 <= local_84) {
      local_84 = (in_RDI->common).delta_q_info.delta_q_res * 0x14 + -1;
    }
    if (local_84 <= (in_RDI->common).delta_q_info.delta_q_res * -0x14 + 1) {
      local_84 = (in_RDI->common).delta_q_info.delta_q_res * -0x14 + 1;
    }
    local_84 = (in_RDI->common).quant_params.base_qindex + local_84;
    if (0xfe < local_84) {
      local_84 = 0xff;
    }
    if (local_84 < 1) {
      local_88 = 0;
    }
    else {
      local_88 = local_84;
    }
    if ((0 < iVar1) && (local_88 < 2)) {
      local_8c = 1;
      local_88 = local_8c;
    }
  }
  else {
    local_88 = get_rate_guided_quantizer
                         (in_stack_00000020,in_stack_0000001f,in_stack_00000018,in_stack_00000014);
  }
  return local_88;
}

Assistant:

int av1_get_sbq_perceptual_ai(const AV1_COMP *const cpi, BLOCK_SIZE bsize,
                              int mi_row, int mi_col) {
  if (cpi->oxcf.enable_rate_guide_deltaq) {
    return get_rate_guided_quantizer(cpi, bsize, mi_row, mi_col);
  }

  const AV1_COMMON *const cm = &cpi->common;
  const int base_qindex = cm->quant_params.base_qindex;
  int sb_wiener_var = get_var_perceptual_ai(cpi, bsize, mi_row, mi_col);
  int offset = 0;
  double beta = (double)cpi->norm_wiener_variance / sb_wiener_var;
  double min_max_scale = AOMMAX(1.0, get_max_scale(cpi, bsize, mi_row, mi_col));
  beta = 1.0 / AOMMIN(1.0 / beta, min_max_scale);

  // Cap beta such that the delta q value is not much far away from the base q.
  beta = AOMMIN(beta, 4);
  beta = AOMMAX(beta, 0.25);
  offset = av1_get_deltaq_offset(cm->seq_params->bit_depth, base_qindex, beta);
  const DeltaQInfo *const delta_q_info = &cm->delta_q_info;
  offset = AOMMIN(offset, delta_q_info->delta_q_res * 20 - 1);
  offset = AOMMAX(offset, -delta_q_info->delta_q_res * 20 + 1);
  int qindex = cm->quant_params.base_qindex + offset;
  qindex = AOMMIN(qindex, MAXQ);
  qindex = AOMMAX(qindex, MINQ);
  if (base_qindex > MINQ) qindex = AOMMAX(qindex, MINQ + 1);

  return qindex;
}